

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O3

void bloaty::AddDIE(CU *cu,GeneralDIE *die,DualMap *symbol_map,RangeSink *sink)

{
  ulong uVar1;
  char cVar2;
  size_t sVar3;
  File *pFVar4;
  _func_int **pp_Var5;
  bool bVar6;
  size_type __rlen_1;
  CU *cu_00;
  ulong uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  long lVar10;
  InputFile *pIVar11;
  pointer pcVar12;
  size_type __rlen;
  MessageLite MVar14;
  ulong uVar15;
  char *pcVar16;
  MessageLite filesize;
  uint64_t uVar17;
  Arena *name;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  IVar18;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view data;
  uint64_t size;
  string_view *in_stack_ffffffffffffff88;
  string_view local_68;
  undefined1 local_58 [32];
  Arena *local_38;
  size_type sVar13;
  
  cu_00 = (CU *)TryReadPcPair(cu,die,sink);
  if ((die->location_string).
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == true) {
    sVar3 = (die->location_string).
            super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
            _M_payload.
            super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
            _M_payload._M_value._M_len;
    bVar6 = (cu->unit_sizes_).addr8_;
    if ((sVar3 == (ulong)bVar6 * 4 + 5) &&
       (pcVar16 = (die->location_string).
                  super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                  ._M_payload._M_value._M_str, *pcVar16 == '\x03')) {
      if (bVar6 == false) {
        uVar8 = (uint64_t)*(uint *)(pcVar16 + 1);
      }
      else {
        if (sVar3 - 1 < 8) goto LAB_001b6005;
        uVar8 = *(uint64_t *)(pcVar16 + 1);
      }
      bVar6 = RangeMap::TryGetSize(&symbol_map->vm_map,uVar8,(uint64_t *)local_58);
      if (bVar6) {
        RangeSink::AddVMRangeIgnoreDuplicate
                  (sink,"dwarf_location",uVar8,local_58._0_8_,&cu->unit_name_);
      }
      else if (0 < verbose_level) {
        fprintf(_stderr,
                "bloaty: warning: couldn\'t find DWARF location in symbol table, address: %lx, name: %s\n"
                ,uVar8,(cu->unit_name_)._M_dataplus._M_p);
      }
    }
  }
  if ((die->location_uint64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    uVar15 = (die->location_uint64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    uVar7 = (cu->dwarf_->debug_loc)._M_len;
    MVar14._vptr_MessageLite = (_func_int **)(uVar7 - uVar15);
    if (uVar7 < uVar15 || MVar14._vptr_MessageLite == (_func_int **)0x0) {
      if (0 < verbose_level) {
        fprintf(_stderr,"bloaty: warning: DWARF location out of range, location=%lx\n",uVar15);
      }
    }
    else {
      IVar18.ptr_ = (cu->dwarf_->debug_loc)._M_str + uVar15;
      local_58._0_4_ = cu->unit_sizes_;
      local_58._8_8_ = MVar14._vptr_MessageLite;
      local_58._16_8_ = IVar18.ptr_;
      do {
        bVar6 = dwarf::LocationList::NextEntry((LocationList *)local_58);
      } while (bVar6);
      pcVar16 = (sink->file_->data_)._M_str;
      if ((pcVar16 <= IVar18.ptr_) && (IVar18.ptr_ < pcVar16 + (sink->file_->data_)._M_len)) {
        filesize._vptr_MessageLite = (_func_int **)(local_58._16_8_ - (long)IVar18.ptr_);
        if (MVar14._vptr_MessageLite < (_func_int **)(local_58._16_8_ - (long)IVar18.ptr_)) {
          filesize._vptr_MessageLite = MVar14._vptr_MessageLite;
        }
        name_01._M_str = (cu->unit_name_)._M_dataplus._M_p;
        name_01._M_len = (cu->unit_name_)._M_string_length;
        RangeSink::AddFileRange
                  (sink,"dwarf_locrange",name_01,(long)IVar18.ptr_ - (long)pcVar16,
                   (uint64_t)filesize._vptr_MessageLite);
      }
    }
  }
  if ((die->rnglistx).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged != true) {
    lVar10 = 0x90;
    if ((((die->ranges).super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_engaged != false) ||
        (lVar10 = 0xa0,
        (die->start_scope).super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged == true)) &&
       (uVar15 = *(ulong *)((long)&(die->name).
                                   super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   ._M_payload + lVar10), uVar15 != 0xffffffffffffffff)) {
      uVar7 = (cu->dwarf_->debug_ranges)._M_len;
      pIVar11 = (InputFile *)(uVar7 - uVar15);
      if (uVar7 < uVar15 || pIVar11 == (InputFile *)0x0) {
        if (0 < verbose_level) {
          fprintf(_stderr,"bloaty: warning: DWARF debug range out of range, ranges_offset=%lx\n",
                  uVar15);
        }
      }
      else {
        MVar14._vptr_MessageLite = (_func_int **)((cu->dwarf_->debug_ranges)._M_str + uVar15);
        name_00._M_str = (char *)sink;
        name_00._M_len = (size_t)(cu->unit_name_)._M_dataplus._M_p;
        local_58._0_8_ = pIVar11;
        local_58._8_8_ = MVar14._vptr_MessageLite;
        dwarf::ReadRangeList
                  ((dwarf *)cu,cu_00,(cu->unit_name_)._M_string_length,name_00,(RangeSink *)local_58
                   ,in_stack_ffffffffffffff88);
        pp_Var5 = (_func_int **)(sink->file_->data_)._M_str;
        if ((pp_Var5 <= MVar14._vptr_MessageLite) &&
           (MVar14._vptr_MessageLite < (_func_int **)((sink->file_->data_)._M_len + (long)pp_Var5)))
        {
          pcVar12 = (cu->unit_name_)._M_dataplus._M_p;
          sVar13 = (cu->unit_name_)._M_string_length;
          uVar17 = local_58._8_8_ - (long)MVar14._vptr_MessageLite;
          uVar8 = (long)MVar14._vptr_MessageLite - (long)pp_Var5;
          pcVar16 = "dwarf_debugrange";
LAB_001b610a:
          name_02._M_str = pcVar12;
          name_02._M_len = sVar13;
          RangeSink::AddFileRange(sink,pcVar16,name_02,uVar8,uVar17);
        }
      }
    }
    return;
  }
  uVar15 = (cu->dwarf_->debug_rnglists)._M_len;
  uVar7 = ((die->rnglistx).super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload._M_value <<
          ((cu->unit_sizes_).dwarf64_ & 0x3fU | 2)) + cu->range_lists_base_;
  if (uVar15 < uVar7) {
LAB_001b61af:
    Throw("region out-of-bounds",100);
  }
  local_58._8_8_ = (cu->dwarf_->debug_rnglists)._M_str + uVar7;
  local_58._0_8_ = (InputFile *)(uVar15 - uVar7);
  uVar8 = dwarf::CompilationUnitSizes::ReadDWARFOffset(&cu->unit_sizes_,(string_view *)local_58);
  uVar15 = (cu->dwarf_->debug_rnglists)._M_len;
  uVar7 = uVar8 + cu->range_lists_base_;
  if (uVar15 < uVar7) goto LAB_001b61af;
  local_68._M_str = (cu->dwarf_->debug_rnglists)._M_str + uVar7;
  local_68._M_len = uVar15 - uVar7;
  local_58._24_8_ = local_68._M_str;
  if (local_68._M_len == 0) {
LAB_001b6005:
    Throw("premature EOF reading fixed-length data",0x8d);
  }
  name = (Arena *)&cu->unit_name_;
  uVar15 = cu->addr_base_;
  local_38 = name;
LAB_001b5ddf:
  cVar2 = *local_68._M_str;
  local_68._M_str = local_68._M_str + 1;
  local_68._M_len = local_68._M_len - 1;
  switch(cVar2) {
  case '\0':
    pcVar16 = (sink->file_->data_)._M_str;
    if ((ulong)local_58._24_8_ < pcVar16) {
      return;
    }
    if (pcVar16 + (sink->file_->data_)._M_len <= (ulong)local_58._24_8_) {
      return;
    }
    pcVar12 = (cu->unit_name_)._M_dataplus._M_p;
    sVar13 = (cu->unit_name_)._M_string_length;
    uVar17 = (long)local_68._M_str - local_58._24_8_;
    uVar8 = local_58._24_8_ - (long)pcVar16;
    pcVar16 = "dwarf_rangelst_addrs";
    goto LAB_001b610a;
  case '\x01':
    uVar17 = dwarf::ReadLEB128Internal(false,&local_68);
    pFVar4 = cu->skeleton_->dwarf_;
    uVar8 = cu->skeleton_->addr_base_;
    uVar15 = (pFVar4->debug_addr)._M_len;
    pcVar16 = (pFVar4->debug_addr)._M_str;
    if ((cu->unit_sizes_).addr8_ != false) {
      uVar7 = uVar8 + uVar17 * 8;
      if (uVar15 < uVar7) {
LAB_001b618d:
        Throw("premature EOF reading variable-length DWARF data",0xad);
      }
      if (7 < uVar15 - uVar7) {
        uVar15 = *(ulong *)(pcVar16 + uVar7);
        goto switchD_001b5e08_default;
      }
      goto LAB_001b6005;
    }
    uVar7 = uVar8 + uVar17 * 4;
    if (uVar15 < uVar7) goto LAB_001b618d;
    if (uVar15 - uVar7 < 4) goto LAB_001b6005;
    uVar15 = (ulong)*(uint *)(pcVar16 + uVar7);
    goto switchD_001b5e08_default;
  case '\x02':
    uVar17 = dwarf::ReadLEB128Internal(false,&local_68);
    pFVar4 = cu->skeleton_->dwarf_;
    uVar8 = cu->skeleton_->addr_base_;
    uVar7 = (pFVar4->debug_addr)._M_len;
    pcVar16 = (pFVar4->debug_addr)._M_str;
    if ((cu->unit_sizes_).addr8_ == false) {
      uVar1 = uVar8 + uVar17 * 4;
      if (uVar7 < uVar1) goto LAB_001b618d;
      if (uVar7 - uVar1 < 4) goto LAB_001b6005;
      uVar8 = (uint64_t)*(uint *)(pcVar16 + uVar1);
    }
    else {
      uVar1 = uVar8 + uVar17 * 8;
      if (uVar7 < uVar1) goto LAB_001b618d;
      if (uVar7 - uVar1 < 8) goto LAB_001b6005;
      uVar8 = *(uint64_t *)(pcVar16 + uVar1);
    }
    uVar9 = dwarf::ReadLEB128Internal(false,&local_68);
    pFVar4 = cu->skeleton_->dwarf_;
    uVar17 = cu->skeleton_->addr_base_;
    uVar7 = (pFVar4->debug_addr)._M_len;
    pcVar16 = (pFVar4->debug_addr)._M_str;
    if ((cu->unit_sizes_).addr8_ == false) {
      uVar1 = uVar17 + uVar9 * 4;
      if (uVar7 < uVar1) goto LAB_001b618d;
      if (uVar7 - uVar1 < 4) goto LAB_001b6005;
      uVar7 = (ulong)*(uint *)(pcVar16 + uVar1);
    }
    else {
      uVar1 = uVar17 + uVar9 * 8;
      if (uVar7 < uVar1) goto LAB_001b618d;
      if (uVar7 - uVar1 < 8) goto LAB_001b6005;
      uVar7 = *(ulong *)(pcVar16 + uVar1);
    }
    uVar9 = uVar7 - uVar8;
    break;
  case '\x03':
    uVar17 = dwarf::ReadLEB128Internal(false,&local_68);
    pFVar4 = cu->skeleton_->dwarf_;
    uVar8 = cu->skeleton_->addr_base_;
    uVar7 = (pFVar4->debug_addr)._M_len;
    pcVar16 = (pFVar4->debug_addr)._M_str;
    if ((cu->unit_sizes_).addr8_ == false) {
      uVar1 = uVar8 + uVar17 * 4;
      if (uVar7 < uVar1) goto LAB_001b618d;
      if (uVar7 - uVar1 < 4) goto LAB_001b6005;
      uVar8 = (uint64_t)*(uint *)(pcVar16 + uVar1);
    }
    else {
      uVar1 = uVar8 + uVar17 * 8;
      if (uVar7 < uVar1) goto LAB_001b618d;
      if (uVar7 - uVar1 < 8) goto LAB_001b6005;
      uVar8 = *(uint64_t *)(pcVar16 + uVar1);
    }
    uVar9 = dwarf::ReadLEB128Internal(false,&local_68);
    break;
  case '\x04':
    uVar17 = dwarf::ReadLEB128Internal(false,&local_68);
    uVar8 = uVar17 + uVar15;
    uVar9 = dwarf::ReadLEB128Internal(false,&local_68);
    uVar9 = uVar9 - uVar17;
    name = local_38;
    break;
  case '\x05':
  case '\x06':
  case '\a':
    Throw("NYI",0x1fe);
  default:
    goto switchD_001b5e08_default;
  }
  RangeSink::AddVMRangeIgnoreDuplicate(sink,"dwarf_rangelst",uVar8,uVar9,(string *)name);
switchD_001b5e08_default:
  if (local_68._M_len == 0) goto LAB_001b6005;
  goto LAB_001b5ddf;
}

Assistant:

void AddDIE(const dwarf::CU& cu, const GeneralDIE& die,
            const DualMap& symbol_map, RangeSink* sink) {
  uint64_t low_pc = TryReadPcPair(cu, die, sink);

  // Sometimes the DIE has a "location", which gives the location as an address.
  // This parses a very small subset of the overall DWARF expression grammar.
  if (die.location_string) {
    string_view location = *die.location_string;
    if (location.size() == cu.unit_sizes().address_size() + 1 &&
        location[0] == DW_OP_addr) {
      location.remove_prefix(1);
      uint64_t addr;
      // TODO(haberman): endian?
      if (cu.unit_sizes().address_size() == 4) {
        addr = ReadFixed<uint32_t>(&location);
      } else if (cu.unit_sizes().address_size() == 8) {
        addr = ReadFixed<uint64_t>(&location);
      } else {
        BLOATY_UNREACHABLE();
      }

      // Unfortunately the location doesn't include a size, so we look that part
      // up in the symbol map.
      uint64_t size;
      if (symbol_map.vm_map.TryGetSize(addr, &size)) {
        sink->AddVMRangeIgnoreDuplicate("dwarf_location", addr, size,
                                        cu.unit_name());
      } else {
        if (verbose_level > 0) {
          fprintf(stderr,
                  "bloaty: warning: couldn't find DWARF location in symbol "
                  "table, address: %" PRIx64 ", name: %s\n",
                  addr, cu.unit_name().c_str());
        }
      }
    }
  }

  // Sometimes a location is given as an offset into debug_loc.
  if (die.location_uint64) {
    uint64_t location = *die.location_uint64;;
    if (location < cu.dwarf().debug_loc.size()) {
      std::string_view loc_range = cu.dwarf().debug_loc.substr(location);
      loc_range = GetLocationListRange(cu.unit_sizes(), loc_range);
      sink->AddFileRange("dwarf_locrange", cu.unit_name(), loc_range);
    } else if (verbose_level > 0) {
      fprintf(stderr,
              "bloaty: warning: DWARF location out of range, location=%" PRIx64
              "\n",
              location);
    }
  }

  // DWARF 5 range list is the same information as "ranges" but in a different
  // format.
  if (die.rnglistx) {
    uint64_t range_list = *die.rnglistx;
    size_t offset_size = cu.unit_sizes().dwarf64() ? 8 : 4;
    string_view offset_data =
        StrictSubstr(cu.dwarf().debug_rnglists,
                     cu.range_lists_base() + (range_list * offset_size));
    uint64_t offset = cu.unit_sizes().ReadDWARFOffset(&offset_data);
    string_view data = StrictSubstr(
        cu.dwarf().debug_rnglists, cu.range_lists_base() + offset);
    const char* start = data.data();
    bool done = false;
    uint64_t base_address = cu.addr_base();
    while (!done) {
      switch (ReadFixed<uint8_t>(&data)) {
        case DW_RLE_end_of_list:
          done = true;
          break;
        case DW_RLE_base_addressx:
          base_address =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          break;
        case DW_RLE_startx_endx: {
          uint64_t start =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          uint64_t end =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, end - start,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_startx_length: {
          uint64_t start =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          uint64_t length = dwarf::ReadLEB128<uint64_t>(&data);
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, length,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_offset_pair: {
          uint64_t start = dwarf::ReadLEB128<uint64_t>(&data) + base_address;
          uint64_t end = dwarf::ReadLEB128<uint64_t>(&data) + base_address;
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, end - start,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_base_address:
        case DW_RLE_start_end:
        case DW_RLE_start_length:
          THROW("NYI");
          break;
      }
    }
    string_view all(start, data.data() - start);
    sink->AddFileRange("dwarf_rangelst_addrs", cu.unit_name(), all);
  } else {
    uint64_t ranges_offset = UINT64_MAX;

    // There are two different attributes that sometimes contain an offset into
    // debug_ranges.
    if (die.ranges) {
      ranges_offset = *die.ranges;
    } else if (die.start_scope) {
      ranges_offset = *die.start_scope;
    }

    if (ranges_offset != UINT64_MAX) {
      if (ranges_offset < cu.dwarf().debug_ranges.size()) {
        std::string_view data = cu.dwarf().debug_ranges.substr(ranges_offset);
        const char* start = data.data();
        ReadRangeList(cu, low_pc, cu.unit_name(), sink, &data);
        string_view all(start, data.data() - start);
        sink->AddFileRange("dwarf_debugrange", cu.unit_name(), all);
      } else if (verbose_level > 0) {
        fprintf(stderr,
                "bloaty: warning: DWARF debug range out of range, "
                "ranges_offset=%" PRIx64 "\n",
                ranges_offset);
      }
    }
  }
}